

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

void udp_send_creq(udp_ep *ep,udp_pipe *p)

{
  nni_time nVar1;
  nng_time nVar2;
  udp_sp_msg local_34;
  
  local_34._0_2_ = 0x101;
  local_34.data.us_type = p->proto;
  local_34._4_4_ = p->self_id;
  local_34._8_4_ = p->peer_id;
  local_34.data.us_sequence = p->self_seq;
  p->self_seq = local_34.data.us_sequence + 1;
  local_34.data.us_length = p->rcvmax;
  local_34.creq.us_refresh = (uint8_t)((p->refresh + 999) / 1000);
  nVar1 = nni_clock();
  nVar2 = (long)p->refresh + nVar1;
  p->next_creq = nVar2;
  p->next_wake = nVar2;
  udp_pipe_schedule(p);
  udp_queue_tx(ep,&p->peer_addr,&local_34,(nni_msg *)0x0);
  return;
}

Assistant:

static void
udp_send_creq(udp_ep *ep, udp_pipe *p)
{
	udp_sp_creq creq;
	creq.us_ver       = 0x1;
	creq.us_op_code   = OPCODE_CREQ;
	creq.us_type      = p->proto;
	creq.us_sender_id = p->self_id;
	creq.us_peer_id   = p->peer_id;
	creq.us_sequence  = p->self_seq++;
	creq.us_recv_max  = p->rcvmax;
	creq.us_refresh   = (p->refresh + NNI_SECOND - 1) / NNI_SECOND;
	p->next_creq      = nni_clock() + UDP_PIPE_REFRESH(p);
	p->next_wake      = p->next_creq;

	udp_pipe_schedule(p);
	udp_queue_tx(ep, &p->peer_addr, (void *) &creq, NULL);
}